

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void bc_trie_insert(bc_trie_t *trie,char *key,void *data)

{
  bc_trie_node_t *pbVar1;
  bc_trie_node_t *pbVar2;
  char cVar3;
  bc_trie_node_t *pbVar4;
  
  if (data != (void *)0x0 && (key != (char *)0x0 && trie != (bc_trie_t *)0x0)) {
    pbVar4 = (bc_trie_node_t *)0x0;
    do {
      pbVar1 = trie->root;
      if ((pbVar1 == (bc_trie_node_t *)0x0) ||
         ((pbVar4 != (bc_trie_node_t *)0x0 &&
          (pbVar1 = pbVar4->child, pbVar1 == (_bc_trie_node_t *)0x0)))) {
        pbVar2 = (bc_trie_node_t *)bc_malloc(0x20);
        pbVar2->key = *key;
        pbVar2->child = (_bc_trie_node_t *)0x0;
        pbVar2->data = (void *)0x0;
        pbVar2->next = (_bc_trie_node_t *)0x0;
        if (trie->root == (bc_trie_node_t *)0x0) {
          trie->root = pbVar2;
        }
        else {
          pbVar4->child = pbVar2;
        }
      }
      else {
        pbVar4 = (bc_trie_node_t *)0x0;
        while (pbVar2 = pbVar1, pbVar2 != (bc_trie_node_t *)0x0) {
          cVar3 = pbVar2->key;
          if (cVar3 == *key) goto LAB_00109955;
          pbVar4 = pbVar2;
          pbVar1 = pbVar2->next;
        }
        if (pbVar4 == (bc_trie_node_t *)0x0) {
          pbVar2 = (_bc_trie_node_t *)0x0;
        }
        else {
          pbVar2 = (bc_trie_node_t *)bc_malloc(0x20);
          pbVar2->key = *key;
          pbVar2->data = (void *)0x0;
          pbVar2->next = (_bc_trie_node_t *)0x0;
          pbVar2->child = (_bc_trie_node_t *)0x0;
          pbVar4->next = pbVar2;
        }
      }
      cVar3 = *key;
LAB_00109955:
      key = key + 1;
      pbVar4 = pbVar2;
    } while (cVar3 != '\0');
    if ((pbVar2->data != (void *)0x0) && (trie->free_func != (bc_free_func_t)0x0)) {
      (*trie->free_func)(pbVar2->data);
    }
    pbVar2->data = data;
  }
  return;
}

Assistant:

void
bc_trie_insert(bc_trie_t *trie, const char *key, void *data)
{
    if (trie == NULL || key == NULL || data == NULL)
        return;

    bc_trie_node_t *parent = NULL;
    bc_trie_node_t *previous;
    bc_trie_node_t *current;
    bc_trie_node_t *tmp;

    while (1) {

        if (trie->root == NULL || (parent != NULL && parent->child == NULL)) {
            current = bc_malloc(sizeof(bc_trie_node_t));
            current->key = *key;
            current->data = NULL;
            current->next = NULL;
            current->child = NULL;
            if (trie->root == NULL)
                trie->root = current;
            else
                parent->child = current;
            parent = current;
            goto clean;
        }

        tmp = parent == NULL ? trie->root : parent->child;
        previous = NULL;

        while (tmp != NULL && tmp->key != *key) {
            previous = tmp;
            tmp = tmp->next;
        }

        parent = tmp;

        if (previous == NULL || parent != NULL)
            goto clean;

        current = bc_malloc(sizeof(bc_trie_node_t));
        current->key = *key;
        current->data = NULL;
        current->next = NULL;
        current->child = NULL;
        previous->next = current;
        parent = current;

clean:
        if (*key == '\0') {
            if (parent->data != NULL && trie->free_func != NULL)
                trie->free_func(parent->data);
            parent->data = data;
            break;
        }
        key++;
    }
}